

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O3

void pfx_table_swap(pfx_table *a,pfx_table *b)

{
  long lVar1;
  trie_node *ptVar2;
  trie_node *ptVar3;
  trie_node *ptVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&a->lock);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&b->lock);
  ptVar2 = b->ipv6;
  ptVar3 = a->ipv4;
  ptVar4 = a->ipv6;
  a->ipv4 = b->ipv4;
  a->ipv6 = ptVar2;
  b->ipv4 = ptVar3;
  b->ipv6 = ptVar4;
  pthread_rwlock_unlock((pthread_rwlock_t *)&b->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&a->lock);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pfx_table_swap(struct pfx_table *a, struct pfx_table *b)
{
	struct trie_node *ipv4_tmp;
	struct trie_node *ipv6_tmp;

	pthread_rwlock_wrlock(&(a->lock));
	pthread_rwlock_wrlock(&(b->lock));

	ipv4_tmp = a->ipv4;
	ipv6_tmp = a->ipv6;

	a->ipv4 = b->ipv4;
	a->ipv6 = b->ipv6;

	b->ipv4 = ipv4_tmp;
	b->ipv6 = ipv6_tmp;

	pthread_rwlock_unlock(&(b->lock));
	pthread_rwlock_unlock(&(a->lock));
}